

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.hpp
# Opt level: O1

void __thiscall
sjtu::map<long,_sjtu::LRUCache<sjtu::userType>::CacheNode_*,_std::less<long>_>::erase_fixup
          (map<long,_sjtu::LRUCache<sjtu::userType>::CacheNode_*,_std::less<long>_> *this,Node *x)

{
  color_type cVar1;
  Node *pNVar2;
  Node *pNVar3;
  Node *pNVar4;
  Node *pNVar5;
  Node *pNVar6;
  color_type __tmp;
  
  pNVar2 = this->nil;
LAB_00114b31:
  do {
    while( true ) {
      pNVar5 = x->parent;
      if ((pNVar5 == pNVar2) || (x->color != BLACK)) {
        x->color = BLACK;
        return;
      }
      pNVar6 = pNVar5->left;
      if (pNVar6 == x) break;
      cVar1 = pNVar6->color;
      if (cVar1 == RED) {
        pNVar5 = pNVar6->right;
        pNVar4 = pNVar6->parent;
        if (pNVar5 != pNVar2) {
          pNVar5->parent = pNVar4;
        }
        pNVar4->left = pNVar5;
        pNVar5 = pNVar4->parent;
        (&pNVar5->left)[pNVar5->left != pNVar4] = pNVar6;
        pNVar6->parent = pNVar5;
        pNVar4->parent = pNVar6;
        pNVar6->right = pNVar4;
        goto LAB_00114d57;
      }
      pNVar4 = pNVar6;
      if (pNVar6->left->color == BLACK) {
        if (pNVar6->right->color == BLACK) goto LAB_00114c36;
        pNVar5 = pNVar6->right;
        pNVar4 = pNVar5->left;
        pNVar3 = pNVar5->parent;
        if (pNVar4 != pNVar2) {
          pNVar4->parent = pNVar3;
        }
        pNVar3->right = pNVar4;
        pNVar4 = pNVar3->parent;
        (&pNVar4->left)[pNVar4->left != pNVar3] = pNVar5;
        pNVar5->parent = pNVar4;
        pNVar3->parent = pNVar5;
        pNVar5->left = pNVar3;
        pNVar4 = pNVar6->parent;
        pNVar6->color = pNVar4->color;
        pNVar4->color = cVar1;
      }
      pNVar5 = pNVar4->right;
      pNVar6 = pNVar4->parent;
      if (pNVar5 != pNVar2) {
        pNVar5->parent = pNVar6;
      }
      pNVar6->left = pNVar5;
      pNVar5 = pNVar6->parent;
      (&pNVar5->left)[pNVar5->left != pNVar6] = pNVar4;
      pNVar4->parent = pNVar5;
      pNVar6->parent = pNVar4;
      pNVar4->right = pNVar6;
      cVar1 = pNVar4->color;
      pNVar4->color = pNVar6->color;
      pNVar6->color = cVar1;
      pNVar5 = pNVar4->left;
LAB_00114d12:
      pNVar5->color = BLACK;
      x = pNVar2->left;
    }
    pNVar6 = pNVar5->right;
    cVar1 = pNVar6->color;
    if (cVar1 != RED) {
      pNVar4 = pNVar6->left;
      if ((pNVar4->color != BLACK) || (pNVar6->right->color != BLACK)) {
        pNVar5 = pNVar6;
        if (pNVar6->right->color == BLACK) {
          pNVar5 = pNVar4->right;
          pNVar3 = pNVar4->parent;
          if (pNVar5 != pNVar2) {
            pNVar5->parent = pNVar3;
          }
          pNVar3->left = pNVar5;
          pNVar5 = pNVar3->parent;
          (&pNVar5->left)[pNVar5->left != pNVar3] = pNVar4;
          pNVar4->parent = pNVar5;
          pNVar3->parent = pNVar4;
          pNVar4->right = pNVar3;
          pNVar5 = pNVar6->parent;
          pNVar6->color = pNVar5->color;
          pNVar5->color = cVar1;
        }
        pNVar6 = pNVar5->left;
        pNVar4 = pNVar5->parent;
        if (pNVar6 != pNVar2) {
          pNVar6->parent = pNVar4;
        }
        pNVar4->right = pNVar6;
        pNVar6 = pNVar4->parent;
        (&pNVar6->left)[pNVar6->left != pNVar4] = pNVar5;
        pNVar5->parent = pNVar6;
        pNVar4->parent = pNVar5;
        pNVar5->left = pNVar4;
        cVar1 = pNVar5->color;
        pNVar5->color = pNVar4->color;
        pNVar4->color = cVar1;
        pNVar5 = pNVar5->right;
        goto LAB_00114d12;
      }
LAB_00114c36:
      pNVar6->color = RED;
      x = pNVar5;
      goto LAB_00114b31;
    }
    pNVar5 = pNVar6->left;
    pNVar4 = pNVar6->parent;
    if (pNVar5 != pNVar2) {
      pNVar5->parent = pNVar4;
    }
    pNVar4->right = pNVar5;
    pNVar5 = pNVar4->parent;
    (&pNVar5->left)[pNVar5->left != pNVar4] = pNVar6;
    pNVar6->parent = pNVar5;
    pNVar4->parent = pNVar6;
    pNVar6->left = pNVar4;
LAB_00114d57:
    pNVar6->color = pNVar4->color;
    pNVar4->color = RED;
  } while( true );
}

Assistant:

void erase_fixup(Node *x)
	{
		for (Node *y;x -> parent != nil && x -> color == BLACK;)
			if (x -> parent -> left == x)
			{
				y = x -> parent -> right;
				if (y -> color == RED) left_rotate(y) , std::swap(y -> color , y -> left -> color);
				else if (y -> left -> color == BLACK && y -> right -> color == BLACK) y -> color = RED , x = x -> parent;
				else
				{
					if (y -> right -> color == BLACK)
					{
						right_rotate(y -> left) , std::swap(y -> color , y -> parent -> color);
						y = y -> parent;
					}
					left_rotate(y) , std::swap(y -> color , y -> left -> color) , y -> right -> color = BLACK;
					x = nil -> left;
				}
			}
			else
			{
				y = x -> parent -> left;
				if (y -> color == RED) right_rotate(y) , std::swap(y -> color , y -> right -> color);
				else if (y -> left -> color == BLACK && y -> right -> color == BLACK) y -> color = RED , x = x -> parent;
				else
				{
					if (y -> left -> color == BLACK)
					{
						left_rotate(y -> right) , std::swap(y -> color , y -> parent -> color);
						y = y -> parent;
					}
					right_rotate(y) , std::swap(y -> color , y -> right -> color) , y -> left -> color = BLACK;
					x = nil -> left;
				}
			}
		x -> color = BLACK;
	}